

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skein.c
# Opt level: O0

int Skein_256_Init(Skein_256_Ctxt_t *ctx,size_t hashBitLen)

{
  u08b_t local_38 [8];
  anon_union_32_2_94730036 cfg;
  size_t hashBitLen_local;
  Skein_256_Ctxt_t *ctx_local;
  
  (ctx->h).hashBitLen = hashBitLen;
  hashBitLen_local = (size_t)ctx;
  if (hashBitLen == 0x80) {
    ctx->X[0] = 0xe1111906964d7260;
    ctx->X[1] = 0x883daaa77c8d811c;
    ctx->X[2] = 0x10080df491960f7a;
    ctx->X[3] = 0xccf7dde5b45bc1c2;
  }
  else if (hashBitLen == 0xa0) {
    ctx->X[0] = 0x1420231472825e98;
    ctx->X[1] = 0x2ac4e9a25a77e590;
    ctx->X[2] = 0xd47a58568838d63e;
    ctx->X[3] = 0x2dd2e4968586ab7d;
  }
  else if (hashBitLen == 0xe0) {
    ctx->X[0] = 0xc6098a8c9ae5ea0b;
    ctx->X[1] = 0x876d568608c5191c;
    ctx->X[2] = 0x99cb88d7d7f53884;
    ctx->X[3] = 0x384bddb1aeddb5de;
  }
  else if (hashBitLen == 0x100) {
    ctx->X[0] = 0xfc9da860d048b449;
    ctx->X[1] = 0x2fca66479fa7d833;
    ctx->X[2] = 0xb33bc3896656840f;
    ctx->X[3] = 0x6a54e920fde8da69;
  }
  else {
    (ctx->h).T[0] = 0;
    (ctx->h).T[1] = 0xc400000000000000;
    (ctx->h).bCnt = 0;
    builtin_memcpy(local_38,"SHA3\x01",6);
    local_38[6] = '\0';
    local_38[7] = '\0';
    cfg.w[1] = 0;
    cfg.w[0] = hashBitLen;
    cfg.w[3] = hashBitLen;
    memset(cfg.b + 0x10,0,8);
    memset((void *)(hashBitLen_local + 0x20),0,0x20);
    Skein_256_Process_Block((Skein_256_Ctxt_t *)hashBitLen_local,local_38,1,0x20);
  }
  *(undefined8 *)(hashBitLen_local + 0x10) = 0;
  *(undefined8 *)(hashBitLen_local + 0x18) = 0x7000000000000000;
  *(undefined8 *)(hashBitLen_local + 8) = 0;
  return 0;
}

Assistant:

int Skein_256_Init(Skein_256_Ctxt_t *ctx, size_t hashBitLen)
{
    union
    {
        u08b_t  b[SKEIN_256_STATE_BYTES];
        u64b_t  w[SKEIN_256_STATE_WORDS];
    } cfg;                              /* config block */

    Skein_Assert(hashBitLen > 0,SKEIN_BAD_HASHLEN);
    ctx->h.hashBitLen = hashBitLen;         /* output hash bit count */

    switch (hashBitLen)
    {             /* use pre-computed values, where available */
    case  256:
        memcpy(ctx->X,SKEIN_256_IV_256,sizeof(ctx->X));
        break;
    case  224:
        memcpy(ctx->X,SKEIN_256_IV_224,sizeof(ctx->X));
        break;
    case  160:
        memcpy(ctx->X,SKEIN_256_IV_160,sizeof(ctx->X));
        break;
    case  128:
        memcpy(ctx->X,SKEIN_256_IV_128,sizeof(ctx->X));
        break;
    default:
        /* here if there is no precomputed IV value available */
        /* build/process the config block, type == CONFIG (could be precomputed) */
        Skein_Start_New_Type(ctx,CFG_FINAL);        /* set tweaks: T0=0; T1=CFG | FINAL */

        cfg.w[0] = Skein_Swap64(SKEIN_SCHEMA_VER);  /* set the schema, version */
        cfg.w[1] = Skein_Swap64(hashBitLen);        /* hash result length in bits */
        cfg.w[2] = Skein_Swap64(SKEIN_CFG_TREE_INFO_SEQUENTIAL);
        memset(&cfg.w[3],0,sizeof(cfg) - 3*sizeof(cfg.w[0])); /* zero pad config block */

        /* compute the initial chaining values from config block */
        memset(ctx->X,0,sizeof(ctx->X));            /* zero the chaining variables */
        Skein_256_Process_Block(ctx,cfg.b,1,SKEIN_CFG_STR_LEN);
        break;
    }
    /* The chaining vars ctx->X are now initialized for the given hashBitLen. */
    /* Set up to process the data message portion of the hash (default) */
    Skein_Start_New_Type(ctx,MSG);              /* T0=0, T1= MSG type */

    return SKEIN_SUCCESS;
}